

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

void ImGui::Scrollbar(ImGuiAxis axis)

{
  float fVar1;
  ImGuiWindow *this;
  ImGuiID id;
  long lVar2;
  char *str;
  int rounding_corners;
  bool bVar3;
  ImRect bb;
  ImRect local_28;
  
  this = GImGui->CurrentWindow;
  str = "#SCROLLY";
  if (axis == ImGuiAxis_X) {
    str = "#SCROLLX";
  }
  id = ImGuiWindow::GetIDNoKeepAlive(this,str,(char *)0x0);
  KeepAliveID(id);
  local_28 = GetWindowScrollbarRect(this,axis);
  if (axis == ImGuiAxis_X) {
    rounding_corners = (this->ScrollbarY ^ 1) * 8 + 4;
    lVar2 = 0;
  }
  else {
    bVar3 = (this->Flags & 0x401U) == 1;
    rounding_corners = (uint)bVar3 * 2 + 8;
    if (this->ScrollbarX != false) {
      rounding_corners = (uint)bVar3 * 2;
    }
    lVar2 = 1;
    if (axis != ImGuiAxis_Y) {
      __assert_fail("idx <= 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.h"
                    ,0xd6,"float &ImVec2::operator[](size_t)");
    }
  }
  fVar1 = (&(this->WindowPadding).x)[lVar2];
  ScrollbarEx(&local_28,id,axis,&(this->Scroll).x + lVar2,
              (&(this->InnerRect).Max.x)[lVar2] - (&(this->InnerRect).Min.x)[lVar2],
              fVar1 + fVar1 + (&(this->ContentSize).x)[lVar2],rounding_corners);
  return;
}

Assistant:

void ImGui::Scrollbar(ImGuiAxis axis)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    const ImGuiID id = GetWindowScrollbarID(window, axis);
    KeepAliveID(id);

    // Calculate scrollbar bounding box
    ImRect bb = GetWindowScrollbarRect(window, axis);
    ImDrawCornerFlags rounding_corners = 0;
    if (axis == ImGuiAxis_X)
    {
        rounding_corners |= ImDrawCornerFlags_BotLeft;
        if (!window->ScrollbarY)
            rounding_corners |= ImDrawCornerFlags_BotRight;
    }
    else
    {
        if ((window->Flags & ImGuiWindowFlags_NoTitleBar) && !(window->Flags & ImGuiWindowFlags_MenuBar))
            rounding_corners |= ImDrawCornerFlags_TopRight;
        if (!window->ScrollbarX)
            rounding_corners |= ImDrawCornerFlags_BotRight;
    }
    float size_avail = window->InnerRect.Max[axis] - window->InnerRect.Min[axis];
    float size_contents = window->ContentSize[axis] + window->WindowPadding[axis] * 2.0f;
    ScrollbarEx(bb, id, axis, &window->Scroll[axis], size_avail, size_contents, rounding_corners);
}